

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# image_function.cpp
# Opt level: O0

void Image_Function::Fill
               (Image *image,uint32_t x,uint32_t y,uint32_t width,uint32_t height,uint8_t value)

{
  byte bVar1;
  uint uVar2;
  uint32_t uVar3;
  uchar *puVar4;
  uchar *puVar5;
  uint32_t in_ECX;
  int in_EDX;
  int in_ESI;
  ImageTemplate<unsigned_char> *in_RDI;
  uint32_t in_R8D;
  byte in_R9B;
  uint8_t *imageYEnd;
  uint8_t *imageY;
  uint32_t rowSize;
  uint8_t colorCount;
  ImageTemplate<unsigned_char> *in_stack_ffffffffffffffd0;
  uint32_t *in_stack_ffffffffffffffd8;
  uint32_t in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe4;
  undefined1 in_stack_ffffffffffffffe6;
  
  ParameterValidation<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((ImageTemplate<unsigned_char> *)CONCAT44(in_ESI,in_EDX),in_ECX,in_R8D,
             CONCAT13(in_R9B,CONCAT12(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe4)),
             in_stack_ffffffffffffffe0);
  bVar1 = PenguinV_Image::ImageTemplate<unsigned_char>::colorCount(in_RDI);
  uVar2 = in_ECX * bVar1;
  OptimiseRoi<PenguinV_Image::ImageTemplate<unsigned_char>>
            ((uint32_t *)
             CONCAT17(in_R9B,CONCAT16(bVar1,CONCAT24(in_stack_ffffffffffffffe4,
                                                     in_stack_ffffffffffffffe0))),
             in_stack_ffffffffffffffd8,in_stack_ffffffffffffffd0);
  uVar3 = PenguinV_Image::ImageTemplate<unsigned_char>::rowSize(in_RDI);
  puVar4 = PenguinV_Image::ImageTemplate<unsigned_char>::data(in_RDI);
  puVar4 = puVar4 + (ulong)(in_ESI * (uint)bVar1) + (ulong)(in_EDX * uVar3);
  puVar5 = puVar4 + in_R8D * uVar3;
  for (; puVar4 != puVar5; puVar4 = puVar4 + uVar3) {
    memset(puVar4,(uint)in_R9B,(ulong)uVar2);
  }
  return;
}

Assistant:

void Fill( Image & image, uint32_t x, uint32_t y, uint32_t width, uint32_t height, uint8_t value )
    {
        ParameterValidation( image, x, y, width, height );

        const uint8_t colorCount = image.colorCount();
        width = width * colorCount;

        OptimiseRoi( width, height, image );

        const uint32_t rowSize = image.rowSize();

        uint8_t * imageY = image.data() + y * rowSize + x * colorCount;
        const uint8_t * imageYEnd = imageY + height * rowSize;

        for( ; imageY != imageYEnd; imageY += rowSize )
            memset( imageY, value, sizeof( uint8_t ) * width );
    }